

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O2

void (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
               (AnnotatedMixin<std::recursive_mutex> *mutex1,
               AnnotatedMixin<std::recursive_mutex> *mutex2)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar2;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  string lockname;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::recursive_mutex::lock(&mutex1->super_recursive_mutex);
  std::recursive_mutex::lock(&mutex2->super_recursive_mutex);
  lockname._M_string_length = 0;
  lockname.field_2._M_allocated_capacity =
       lockname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  lockname._M_dataplus._M_p = (pointer)&lockname.field_2;
  pthread_mutex_unlock((pthread_mutex_t *)mutex2);
  std::__cxx11::string::~string((string *)&lockname);
  lockname._M_string_length = 0;
  lockname.field_2._M_allocated_capacity =
       lockname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  lockname._M_dataplus._M_p = (pointer)&lockname.field_2;
  pthread_mutex_unlock((pthread_mutex_t *)mutex1);
  std::__cxx11::string::~string((string *)&lockname);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4c;
  file.m_begin = (iterator)&local_60;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
  local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_88.m_message.px = (element_type *)0x0;
  local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
  lockname.field_2._8_8_ = &local_98;
  local_98 = "LockStackEmpty()";
  local_90 = "";
  lockname._M_string_length = lockname._M_string_length & 0xffffffffffffff00;
  lockname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  lockname.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_a0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,(lazy_ostream *)&lockname,1,0,WARN,_cVar2,(size_t)&local_a8,0x4c);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestInconsistentLockOrderDetected(MutexType& mutex1, MutexType& mutex2) NO_THREAD_SAFETY_ANALYSIS
{
    ENTER_CRITICAL_SECTION(mutex1);
    ENTER_CRITICAL_SECTION(mutex2);
#ifdef DEBUG_LOCKORDER
    BOOST_CHECK_EXCEPTION(LEAVE_CRITICAL_SECTION(mutex1), std::logic_error, HasReason("mutex1 was not most recent critical section locked"));
#endif // DEBUG_LOCKORDER
    LEAVE_CRITICAL_SECTION(mutex2);
    LEAVE_CRITICAL_SECTION(mutex1);
    BOOST_CHECK(LockStackEmpty());
}